

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1adff5::FunctionParam::printLeft(FunctionParam *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  
  OutputStream::grow(S,2);
  pcVar1 = S->Buffer;
  sVar2 = S->CurrentPosition;
  (pcVar1 + sVar2)[0] = 'f';
  (pcVar1 + sVar2)[1] = 'p';
  S->CurrentPosition = S->CurrentPosition + 2;
  pcVar1 = (this->Number).First;
  sVar2 = (long)(this->Number).Last - (long)pcVar1;
  if (sVar2 != 0) {
    OutputStream::grow(S,sVar2);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar2);
    S->CurrentPosition = S->CurrentPosition + sVar2;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "fp";
    S += Number;
  }